

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

int __thiscall
tchecker::typed_local_array_statement_t::clone
          (typed_local_array_statement_t *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  typed_var_expression_t *ptVar1;
  typed_expression_t *ptVar2;
  typed_local_array_statement_t *this_00;
  undefined1 local_30 [8];
  shared_ptr<const_tchecker::typed_expression_t> size_clone;
  shared_ptr<const_tchecker::typed_var_expression_t> variable_clone;
  typed_local_array_statement_t *this_local;
  
  ptVar1 = variable(this);
  ptVar1 = (typed_var_expression_t *)
           (**(code **)(*(long *)&(ptVar1->super_typed_lvalue_expression_t).super_typed_expression_t
                       + 0x28))();
  std::shared_ptr<tchecker::typed_var_expression_t_const>::
  shared_ptr<tchecker::typed_var_expression_t,void>
            ((shared_ptr<tchecker::typed_var_expression_t_const> *)
             &size_clone.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,ptVar1);
  ptVar2 = size(this);
  ptVar2 = (typed_expression_t *)(**(code **)(*(long *)ptVar2 + 0x28))();
  std::shared_ptr<tchecker::typed_expression_t_const>::shared_ptr<tchecker::typed_expression_t,void>
            ((shared_ptr<tchecker::typed_expression_t_const> *)local_30,ptVar2);
  this_00 = (typed_local_array_statement_t *)operator_new(0x38);
  typed_local_array_statement_t
            (this_00,(this->super_typed_statement_t)._type,
             (shared_ptr<const_tchecker::typed_var_expression_t> *)
             &size_clone.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(shared_ptr<const_tchecker::typed_expression_t> *)local_30);
  std::shared_ptr<const_tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_expression_t> *)local_30);
  std::shared_ptr<const_tchecker::typed_var_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_var_expression_t> *)
             &size_clone.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (int)this_00;
}

Assistant:

tchecker::typed_local_array_statement_t * typed_local_array_statement_t::clone() const
{
  std::shared_ptr<tchecker::typed_var_expression_t const> variable_clone{variable().clone()};
  std::shared_ptr<tchecker::typed_expression_t const> size_clone{size().clone()};
  return new tchecker::typed_local_array_statement_t(_type, variable_clone, size_clone);
}